

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::buildTimeMap(MidiFile *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MidiEvent *pMVar6;
  double dStack_60;
  int curtick;
  double cursec;
  double lastsec;
  double secondsPerTick;
  double defaultTempo;
  int tpq;
  int i;
  int tickinit;
  int lasttick;
  _TickTime value;
  int allocsize;
  int timestate;
  int trackstate;
  MidiFile *this_local;
  
  iVar3 = getTrackState(this);
  iVar4 = getTickState(this);
  makeAbsoluteTicks(this);
  joinTracks(this);
  value.seconds._4_4_ = getNumEvents(this,0);
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::reserve
            (&this->m_timemap,(long)(value.seconds._4_4_ + 10));
  std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::clear(&this->m_timemap);
  i = 0;
  bVar1 = false;
  iVar5 = getTicksPerQuarterNote(this);
  lastsec = 60.0 / ((double)iVar5 * 120.0);
  cursec = 0.0;
  dStack_60 = 0.0;
  for (defaultTempo._4_4_ = 0; iVar5 = getNumEvents(this,0), defaultTempo._4_4_ < iVar5;
      defaultTempo._4_4_ = defaultTempo._4_4_ + 1) {
    pMVar6 = getEvent(this,0,defaultTempo._4_4_);
    iVar5 = pMVar6->tick;
    pMVar6 = getEvent(this,0,defaultTempo._4_4_);
    pMVar6->seconds = dStack_60;
    if ((i < iVar5) || (!bVar1)) {
      bVar1 = true;
      dStack_60 = (double)(iVar5 - i) * lastsec + cursec;
      pMVar6 = getEvent(this,0,defaultTempo._4_4_);
      pMVar6->seconds = dStack_60;
      tickinit = iVar5;
      value._0_8_ = dStack_60;
      std::vector<smf::_TickTime,_std::allocator<smf::_TickTime>_>::push_back
                (&this->m_timemap,(value_type *)&tickinit);
      cursec = dStack_60;
      i = iVar5;
    }
    pMVar6 = getEvent(this,0,defaultTempo._4_4_);
    bVar2 = MidiMessage::isTempo(&pMVar6->super_MidiMessage);
    if (bVar2) {
      pMVar6 = getEvent(this,0,defaultTempo._4_4_);
      iVar5 = getTicksPerQuarterNote(this);
      lastsec = MidiMessage::getTempoSPT(&pMVar6->super_MidiMessage,iVar5);
    }
  }
  if (iVar4 == 0) {
    deltaTicks(this);
  }
  if (iVar3 == 0) {
    splitTracks(this);
  }
  this->m_timemapvalid = true;
  return;
}

Assistant:

void MidiFile::buildTimeMap(void) {

	// convert the MIDI file to absolute time representation
	// in single track mode (and undo if the MIDI file was not
	// in that state when this function was called.
	//
	int trackstate = getTrackState();
	int timestate  = getTickState();

	makeAbsoluteTicks();
	joinTracks();

	int allocsize = getNumEvents(0);
	m_timemap.reserve(allocsize+10);
	m_timemap.clear();

	_TickTime value;

	int lasttick = 0;
	int tickinit = 0;

	int i;
	int tpq = getTicksPerQuarterNote();
	double defaultTempo = 120.0;
	double secondsPerTick = 60.0 / (defaultTempo * tpq);

	double lastsec = 0.0;
	double cursec = 0.0;

	for (i=0; i<getNumEvents(0); i++) {
		int curtick = getEvent(0, i).tick;
		getEvent(0, i).seconds = cursec;
		if ((curtick > lasttick) || !tickinit) {
			tickinit = 1;

			// calculate the current time in seconds:
			cursec = lastsec + (curtick - lasttick) * secondsPerTick;
			getEvent(0, i).seconds = cursec;

			// store the new tick to second mapping
			value.tick = curtick;
			value.seconds = cursec;
			m_timemap.push_back(value);
			lasttick   = curtick;
			lastsec    = cursec;
		}

		// update the tempo if needed:
		if (getEvent(0,i).isTempo()) {
			secondsPerTick = getEvent(0,i).getTempoSPT(getTicksPerQuarterNote());
		}
	}

	// reset the states of the tracks or time values if necessary here:
	if (timestate == TIME_STATE_DELTA) {
		deltaTicks();
	}
	if (trackstate == TRACK_STATE_SPLIT) {
		splitTracks();
	}

	m_timemapvalid = 1;

}